

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O3

String * dxil_spv::demangle_entry_point(String *__return_storage_ptr__,String *entry)

{
  pointer __s;
  ulong __n_00;
  void *pvVar1;
  ulong __pos;
  size_type __n;
  char *__data;
  
  __s = (entry->_M_dataplus)._M_p;
  __n_00 = entry->_M_string_length;
  if (__n_00 != 0) {
    pvVar1 = memchr(__s,0x3f,__n_00);
    if (pvVar1 != (void *)0x0 && (long)pvVar1 - (long)__s != -1) {
      __pos = ((long)pvVar1 - (long)__s) + 1;
      if (__pos <= __n_00 && __n_00 - __pos != 0) {
        pvVar1 = memchr(__s + __pos,0x40,__n_00 - __pos);
        if (pvVar1 != (void *)0x0 && (long)pvVar1 - (long)__s != -1) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                    (__return_storage_ptr__,entry,__pos,((long)pvVar1 - (long)__s) - __pos);
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)__return_storage_ptr__,__s,__s + __n_00);
  return __return_storage_ptr__;
}

Assistant:

String demangle_entry_point(const String &entry)
{
	auto start_idx = entry.find_first_of('?');
	if (start_idx == std::string::npos)
		return entry;

	start_idx++;

	auto end_idx = entry.find_first_of('@', start_idx);
	if (end_idx == std::string::npos)
		return entry;

	return entry.substr(start_idx, end_idx - start_idx);
}